

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::isModuleOrPackageDecl(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if (((((((kind == CheckerDeclaration) || (kind == ClassDeclaration)) ||
         (kind == ConstraintDeclaration)) ||
        ((kind == CovergroupDeclaration || (kind - DPIExport < 3)))) ||
       ((kind == ElabSystemTask || ((kind == EmptyMember || (kind - ForwardTypedefDeclaration < 2)))
        ))) || (kind == LetDeclaration)) ||
     (((((kind == NetDeclaration || (kind == NetTypeDeclaration)) ||
        (kind == PackageImportDeclaration)) ||
       (((kind == ParameterDeclarationStatement || (kind == PropertyDeclaration)) ||
        ((kind == SequenceDeclaration || ((kind == TaskDeclaration || (kind == TypedefDeclaration)))
         ))))) || (kind == UserDefinedNetDeclaration)))) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool isModuleOrPackageDecl(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::NetDeclaration:
        case SyntaxKind::UserDefinedNetDeclaration:
        case SyntaxKind::NetTypeDeclaration:
        case SyntaxKind::TypedefDeclaration:
        case SyntaxKind::ForwardTypedefDeclaration:
        case SyntaxKind::PackageImportDeclaration:
        case SyntaxKind::DataDeclaration:
        case SyntaxKind::TaskDeclaration:
        case SyntaxKind::FunctionDeclaration:
        case SyntaxKind::DPIImport:
        case SyntaxKind::DPIExport:
        case SyntaxKind::ClassDeclaration:
        case SyntaxKind::ParameterDeclarationStatement:
        case SyntaxKind::CovergroupDeclaration:
        case SyntaxKind::EmptyMember:
        case SyntaxKind::PropertyDeclaration:
        case SyntaxKind::SequenceDeclaration:
        case SyntaxKind::LetDeclaration:
        case SyntaxKind::ConstraintDeclaration:
        case SyntaxKind::CheckerDeclaration:
        case SyntaxKind::ElabSystemTask:
            return true;
        default:
            return false;
    }
}